

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::ByteSizeLong
          (SoundAnalysisPreprocessing *this)

{
  SoundAnalysisPreprocessingTypeCase SVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SoundAnalysisPreprocessing *this_local;
  
  sStack_18 = 0;
  SVar1 = SoundAnalysisPreprocessingType_case(this);
  if ((SVar1 != SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET) && (SVar1 == kVggish)) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish>
                          ((this->SoundAnalysisPreprocessingType_).vggish_);
    sStack_18 = sStack_18 + 2;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t SoundAnalysisPreprocessing::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  size_t total_size = 0;

  switch (SoundAnalysisPreprocessingType_case()) {
    // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.Vggish vggish = 20;
    case kVggish: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SoundAnalysisPreprocessingType_.vggish_);
      break;
    }
    case SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}